

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void __thiscall diy::MemoryBuffer::swap(MemoryBuffer *this,MemoryBuffer *o)

{
  long in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  vector<char,_std::allocator<char>_> *__x;
  
  __x = in_RDI;
  Catch::clara::std::swap<unsigned_long>
            ((unsigned_long *)
             &(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x8,
             (unsigned_long *)(in_RSI + 8));
  Catch::clara::std::vector<char,_std::allocator<char>_>::swap(unaff_retaddr,__x);
  Catch::clara::std::swap<unsigned_long>
            ((unsigned_long *)
             &in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             (unsigned_long *)(in_RSI + 0x28));
  Catch::clara::std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::swap
            ((vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> *)unaff_retaddr,
             (vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> *)__x);
  return;
}

Assistant:

void                swap(MemoryBuffer& o)                       { std::swap(position, o.position); buffer.swap(o.buffer); std::swap(blob_position, o.blob_position); blobs.swap(o.blobs); }